

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

int __thiscall Dice::addToCount(Dice *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  key_type local_1c;
  
  this_00 = &this->resolvedHand;
  local_1c = Attack;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  iVar1 = *pmVar6;
  local_1c = Celebrity;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  iVar2 = *pmVar6;
  local_1c = Destruction;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  iVar3 = *pmVar6;
  local_1c = Ouch;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  iVar4 = *pmVar6;
  local_1c = Energy;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  iVar5 = *pmVar6;
  local_1c = Heal;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  return iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + *pmVar6;
}

Assistant:

int Dice::addToCount() {
    int count =0;
    count += resolvedHand[DiceOptions::Attack];
    count += resolvedHand[DiceOptions::Celebrity];
    count += resolvedHand[DiceOptions::Destruction];
    count += resolvedHand[DiceOptions::Ouch];
    count += resolvedHand[DiceOptions::Energy];
    count += resolvedHand[DiceOptions::Heal];
    return count;
}